

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O1

ostream * MinVR::operator<<(ostream *os,VRMatrix4 *m)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[[",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[4]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[8]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[0xc]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[5]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[9]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[0xd]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[6]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[10]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[0xe]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[7]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[0xb]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)m->m[0xf]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]]",2);
  return poVar1;
}

Assistant:

std::ostream & operator<< ( std::ostream &os, const VRMatrix4 &m) {
  // format:  ((r1c1, r1c2, r1c3, r1c4), (r2c1, r2c2, r2c3, r2c4), etc.. )
  return os << "[[" << m(0,0) << ", " << m(0,1) << ", " << m(0,2) << ", " << m(0,3) << "], "
        << "[" << m(1,0) << ", " << m(1,1) << ", " << m(1,2) << ", " << m(1,3) << "], "
        << "[" << m(2,0) << ", " << m(2,1) << ", " << m(2,2) << ", " << m(2,3) << "], "
        << "[" << m(3,0) << ", " << m(3,1) << ", " << m(3,2) << ", " << m(3,3) << "]]";
}